

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O3

void despot::option::PrintUsageImplementation::printUsage
               (IStringWriter *write,Descriptor *usage,int width,int last_column_min_percent,
               int last_column_own_line_max_percent)

{
  char cVar1;
  Descriptor *pDVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  LineWrapper *this;
  int iVar13;
  int x;
  int _;
  int col_width [8];
  int tabstop [8];
  LineWrapper lastColumnLineWrapper;
  LineWrapper interjectionLineWrapper;
  int local_284;
  LinePartIterator local_280;
  uint local_23c;
  int local_238;
  int local_234;
  undefined8 local_230;
  int local_228 [18];
  LineWrapper local_1e0;
  LineWrapper local_108;
  
  uVar6 = 10000;
  if ((uint)width < 10000) {
    uVar6 = width;
  }
  uVar12 = 0x50;
  if (0 < width) {
    uVar12 = uVar6;
  }
  local_238 = 1;
  if (0xc6 < last_column_own_line_max_percent * uVar12 + 0x95) {
    local_238 = (int)(last_column_own_line_max_percent * uVar12 + 0x32) / 100;
  }
  local_280.rowdesc = (Descriptor *)0x0;
  local_280.rowstart = (char *)0x0;
  local_280.ptr = (char *)0x0;
  local_280.col = 0xffffffff;
  local_280.len = 0;
  local_280.max_line_in_block = 0;
  local_280.line_in_block = 0;
  local_280.target_line_in_block = 0;
  local_280.hit_target_line = true;
  local_280.tablestart = usage;
  bVar4 = LinePartIterator::nextTable(&local_280);
  if (!bVar4) {
    return;
  }
  local_230 = (ulong)(uint)((int)(last_column_min_percent * uVar12 + 0x32) / 100);
  local_23c = uVar12;
LAB_0016331a:
  uVar6 = local_23c;
  iVar11 = 10000;
LAB_00163320:
  local_228[4] = 0;
  local_228[5] = 0;
  local_228[6] = 0;
  local_228[7] = 0;
  local_228[0] = 0;
  local_228[1] = 0;
  local_228[2] = 0;
  local_228[3] = 0;
  local_280.rowdesc = local_280.tablestart;
  local_280.rowstart = (local_280.tablestart)->help;
  local_280.ptr = (char *)0x0;
  uVar12 = 0;
  do {
    if (local_280.ptr == (char *)0x0) {
      local_280.ptr = local_280.rowstart;
      local_280.col = 0xffffffff;
      local_280.len = 0;
      local_280.screenlen = 0;
      local_280.max_line_in_block = 0;
      local_280.line_in_block = 0;
      local_280.target_line_in_block = 0;
      local_280.hit_target_line = true;
      if (local_280.rowstart == (char *)0x0) break;
    }
    else {
      do {
        local_280.rowstart = local_280.ptr + 1;
        cVar1 = *local_280.ptr;
        if (cVar1 == '\0') {
          local_280.rowstart = local_280.rowdesc[1].help;
          if (local_280.rowstart == (char *)0x0) goto LAB_0016343d;
          local_280.rowdesc = local_280.rowdesc + 1;
          break;
        }
        local_280.ptr = local_280.rowstart;
      } while (cVar1 != '\n');
      local_280.col = 0xffffffff;
      local_280.len = 0;
      local_280.screenlen = 0;
      local_280.max_line_in_block = 0;
      local_280.line_in_block = 0;
      local_280.target_line_in_block = 0;
      local_280.hit_target_line = true;
      local_280.ptr = local_280.rowstart;
    }
    while (bVar4 = LinePartIterator::next(&local_280), bVar4) {
      lVar7 = (long)local_280.col;
      if (lVar7 < 8) {
        if ((int)uVar12 <= local_280.col) {
          uVar12 = local_280.col;
        }
        if ((local_280.screenlen < iVar11) &&
           (((0 < local_280.col || (0 < local_280.target_line_in_block)) ||
            ((byte)(local_280.ptr[local_280.len] | 2U) == 0xb)))) {
          iVar13 = local_280.screenlen;
          if (local_280.screenlen < local_228[lVar7]) {
            iVar13 = local_228[lVar7];
          }
          local_228[lVar7] = iVar13;
        }
      }
    }
  } while( true );
LAB_0016343d:
  uVar8 = (ulong)uVar12;
  if ((int)uVar12 < 1) goto LAB_0016346d;
  uVar9 = 0;
  iVar10 = 0;
  iVar13 = 0;
  do {
    iVar11 = local_228[uVar9];
    iVar10 = iVar10 + iVar11;
    if (iVar11 < iVar13) {
      iVar11 = iVar13;
    }
    uVar9 = uVar9 + 1;
    iVar13 = iVar11;
  } while (uVar8 != uVar9);
  if (iVar10 <= (int)uVar6) goto LAB_0016346d;
  goto LAB_00163320;
LAB_0016346d:
  local_228[8] = 0;
  lVar7 = 1;
  iVar11 = 0;
  do {
    iVar11 = iVar11 + *(int *)((long)&local_230 + lVar7 * 4 + 4);
    local_228[lVar7 + 8] = iVar11;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 8);
  local_1e0.width = uVar6 - local_228[uVar8 + 8];
  if (local_1e0.width < (int)local_230) {
    bVar4 = local_1e0.width < local_228[uVar8];
    if (local_1e0.width < local_228[uVar8]) {
      local_1e0.width = local_238;
    }
  }
  else {
    bVar4 = false;
  }
  iVar11 = uVar6 - local_1e0.width;
  local_1e0.head = 0;
  local_1e0.tail = 0xf;
  if (local_1e0.width < 2) {
    local_1e0.width = 2;
  }
  local_108.x = 0;
  local_108.width = local_23c;
  local_108.head = 0;
  local_108.tail = 0xf;
  if (local_23c < 2) {
    local_108.width = 2;
  }
  local_280.rowdesc = local_280.tablestart;
  local_280.rowstart = (local_280.tablestart)->help;
  local_280.ptr = (char *)0x0;
  bVar4 = (bool)(uVar12 != 0 & bVar4);
  local_1e0.x = iVar11;
  do {
    if (local_280.ptr == (char *)0x0) {
      local_280.ptr = local_280.rowstart;
      local_280.col = 0xffffffff;
      local_280.len = 0;
      local_280.screenlen = 0;
      local_280.max_line_in_block = 0;
      local_280.line_in_block = 0;
      local_280.target_line_in_block = 0;
      local_280.hit_target_line = true;
      pcVar3 = local_280.rowstart;
      if (local_280.rowstart == (char *)0x0) break;
    }
    else {
      do {
        cVar1 = *local_280.ptr;
        if (cVar1 == '\0') {
          pDVar2 = local_280.rowdesc + 1;
          if (pDVar2->help == (char *)0x0) goto LAB_0016376b;
          local_280.rowdesc = local_280.rowdesc + 1;
          pcVar3 = pDVar2->help;
          break;
        }
        pcVar3 = local_280.ptr + 1;
        local_280.ptr = local_280.ptr + 1;
      } while (cVar1 != '\n');
    }
    local_280.rowstart = pcVar3;
    local_280.hit_target_line = true;
    local_280.target_line_in_block = 0;
    local_280.max_line_in_block = 0;
    local_280.line_in_block = 0;
    local_280.screenlen = 0;
    local_280.len = 0;
    local_280.col = 0xffffffff;
    local_284 = -1;
    local_280.ptr = local_280.rowstart;
    while (bVar5 = LinePartIterator::next(&local_280), bVar5) {
      if (local_280.col <= (int)uVar12) {
        uVar6 = local_280.col;
        if (local_280.col == 0) {
          if (local_284 < 0) {
            uVar6 = 0;
          }
          else {
            (*write->_vptr_IStringWriter[2])(write,"\n",1);
            uVar6 = local_280.col;
          }
          local_284 = 0;
        }
        indent(write,&local_284,local_228[(long)(int)uVar6 + 8]);
        if ((local_280.col < (int)uVar12) &&
           (((0 < local_280.col || (0 < local_280.target_line_in_block)) ||
            ((byte)(local_280.ptr[local_280.len] | 2U) == 0xb)))) {
          (*write->_vptr_IStringWriter[2])(write);
          local_284 = local_284 + local_280.screenlen;
        }
        else if (!bVar4) {
          this = &local_1e0;
          if (local_280.col == 0) {
            this = &local_108;
          }
          LineWrapper::process(this,write,local_280.ptr,local_280.len);
        }
      }
    }
    if (bVar4) {
      local_280.ptr = local_280.rowstart;
      local_280.col = 0xffffffff;
      local_280.len = 0;
      local_280.screenlen = 0;
      local_280.max_line_in_block = 0;
      local_280.line_in_block = 0;
      local_280.target_line_in_block = 0;
      local_280.hit_target_line = true;
      while (bVar5 = LinePartIterator::next(&local_280), bVar5) {
        if (local_280.col == uVar12) {
          (*write->_vptr_IStringWriter[2])(write,"\n",1);
          local_234 = 0;
          indent(write,&local_234,iVar11);
          LineWrapper::process(&local_1e0,write,local_280.ptr,local_280.len);
        }
      }
    }
    (*write->_vptr_IStringWriter[2])(write,"\n",1);
    LineWrapper::flush(&local_1e0,write);
    LineWrapper::flush(&local_108,write);
  } while( true );
LAB_0016376b:
  bVar4 = LinePartIterator::nextTable(&local_280);
  if (!bVar4) {
    return;
  }
  goto LAB_0016331a;
}

Assistant:

static void printUsage(IStringWriter& write, const Descriptor usage[],
		int width = 80, //
		int last_column_min_percent = 50, int last_column_own_line_max_percent =
			75) {
		if (width < 1) // protect against nonsense values
			width = 80;

		if (width > 10000) // protect against overflow in the following computation
			width = 10000;

		int last_column_min_width = ((width * last_column_min_percent) + 50)
			/ 100;
		int last_column_own_line_max_width = ((width
			* last_column_own_line_max_percent) + 50) / 100;
		if (last_column_own_line_max_width == 0)
			last_column_own_line_max_width = 1;

		LinePartIterator part(usage);
		while (part.nextTable()) {

			/***************** Determine column widths *******************************/

			const int maxcolumns = 8; // 8 columns are enough for everyone
			int col_width[maxcolumns];
			int lastcolumn;
			int leftwidth;
			int overlong_column_threshold = 10000;
			do {
				lastcolumn = 0;
				for (int i = 0; i < maxcolumns; ++i)
					col_width[i] = 0;

				part.restartTable();
				while (part.nextRow()) {
					while (part.next()) {
						if (part.column() < maxcolumns) {
							upmax(lastcolumn, part.column());
							if (part.screenLength() < overlong_column_threshold)
								// We don't let rows that don't use table separators (\t or \v) influence
								// the width of column 0. This allows the user to interject section headers
								// or explanatory paragraphs that do not participate in the table layout.
								if (part.column() > 0 || part.line() > 0
									|| part.data()[part.length()] == '\t'
									|| part.data()[part.length()] == '\v')
									upmax(col_width[part.column()],
										part.screenLength());
						}
					}
				}

				/*
				 * If the last column doesn't fit on the same
				 * line as the other columns, we can fix that by starting it on its own line.
				 * However we can't do this for any of the columns 0..lastcolumn-1.
				 * If their sum exceeds the maximum width we try to fix this by iteratively
				 * ignoring the widest line parts in the width determination until
				 * we arrive at a series of column widths that fit into one line.
				 * The result is a layout where everything is nicely formatted
				 * except for a few overlong fragments.
				 * */

				leftwidth = 0;
				overlong_column_threshold = 0;
				for (int i = 0; i < lastcolumn; ++i) {
					leftwidth += col_width[i];
					upmax(overlong_column_threshold, col_width[i]);
				}

			} while (leftwidth > width);

			/**************** Determine tab stops and last column handling **********************/

			int tabstop[maxcolumns];
			tabstop[0] = 0;
			for (int i = 1; i < maxcolumns; ++i)
				tabstop[i] = tabstop[i - 1] + col_width[i - 1];

			int rightwidth = width - tabstop[lastcolumn];
			bool print_last_column_on_own_line = false;
			if (rightwidth < last_column_min_width
				&& rightwidth < col_width[lastcolumn]) {
				print_last_column_on_own_line = true;
				rightwidth = last_column_own_line_max_width;
			}

			// If lastcolumn == 0 we must disable print_last_column_on_own_line because
			// otherwise 2 copies of the last (and only) column would be output.
			// Actually this is just defensive programming. It is currently not
			// possible that lastcolumn==0 and print_last_column_on_own_line==true
			// at the same time, because lastcolumn==0 => tabstop[lastcolumn] == 0 =>
			// rightwidth==width => rightwidth>=last_column_min_width  (unless someone passes
			// a bullshit value >100 for last_column_min_percent) => the above if condition
			// is false => print_last_column_on_own_line==false
			if (lastcolumn == 0)
				print_last_column_on_own_line = false;

			LineWrapper lastColumnLineWrapper(width - rightwidth, width);
			LineWrapper interjectionLineWrapper(0, width);

			part.restartTable();

			/***************** Print out all rows of the table *************************************/

			while (part.nextRow()) {
				int x = -1;
				while (part.next()) {
					if (part.column() > lastcolumn)
						continue; // drop excess columns (can happen if lastcolumn == maxcolumns-1)

					if (part.column() == 0) {
						if (x >= 0)
							write("\n", 1);
						x = 0;
					}

					indent(write, x, tabstop[part.column()]);

					if ((part.column() < lastcolumn)
						&& (part.column() > 0 || part.line() > 0
							|| part.data()[part.length()] == '\t'
							|| part.data()[part.length()] == '\v')) {
						write(part.data(), part.length());
						x += part.screenLength();
					} else // either part.column() == lastcolumn or we are in the special case of
						   // an interjection that doesn't contain \v or \t
					{
						// NOTE: This code block is not necessarily executed for
						// each line, because some rows may have fewer columns.

						LineWrapper& lineWrapper =
							(part.column() == 0) ?
								interjectionLineWrapper : lastColumnLineWrapper;

						if (!print_last_column_on_own_line)
							lineWrapper.process(write, part.data(),
								part.length());
					}
				} // while

				if (print_last_column_on_own_line) {
					part.restartRow();
					while (part.next()) {
						if (part.column() == lastcolumn) {
							write("\n", 1);
							int _ = 0;
							indent(write, _, width - rightwidth);
							lastColumnLineWrapper.process(write, part.data(),
								part.length());
						}
					}
				}

				write("\n", 1);
				lastColumnLineWrapper.flush(write);
				interjectionLineWrapper.flush(write);
			}
		}
	}